

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_packbits.c
# Opt level: O2

int PackBitsDecode(TIFF *tif,uint8_t *op,tmsize_t occ,uint16_t s)

{
  uint8_t uVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  ulong c;
  tmsize_t tVar5;
  uint8_t *puVar6;
  
  puVar6 = tif->tif_rawcp;
  tVar5 = tif->tif_rawcc;
  do {
    if ((tVar5 < 1) || (occ < 1)) {
      tif->tif_rawcp = puVar6;
      tif->tif_rawcc = tVar5;
      if (occ < 1) {
        iVar4 = 1;
      }
      else {
LAB_00266ba9:
        iVar4 = 0;
        TIFFErrorExtR(tif,"PackBitsDecode","Not enough data for scanline %u",(ulong)tif->tif_row);
      }
      return iVar4;
    }
    lVar2 = (long)(char)*puVar6;
    if (lVar2 < 0) {
      c = 1U - lVar2;
      if ((ulong)occ < 1U - lVar2) {
        TIFFWarningExtR(tif,"PackBitsDecode","Discarding %ld bytes to avoid buffer overrun");
        c = occ;
      }
      if (tVar5 == 1) {
        lVar2 = 0;
LAB_00266be9:
        TIFFWarningExtR(tif,"PackBitsDecode","Terminating PackBitsDecode due to lack of data.");
        tif->tif_rawcp = puVar6 + 1;
        tif->tif_rawcc = lVar2;
        goto LAB_00266ba9;
      }
      uVar1 = puVar6[1];
      for (uVar3 = c; 0 < (long)uVar3; uVar3 = uVar3 - 1) {
        *op = uVar1;
        op = op + 1;
      }
    }
    else {
      if (occ <= lVar2) {
        TIFFWarningExtR(tif,"PackBitsDecode","Discarding %ld bytes to avoid buffer overrun",
                        (lVar2 - occ) + 1);
        lVar2 = occ - 1;
      }
      c = lVar2 + 1;
      if (tVar5 <= (long)c) {
        lVar2 = tVar5 + -1;
        goto LAB_00266be9;
      }
      _TIFFmemcpy(op,puVar6 + 1,c);
      op = op + c;
      puVar6 = puVar6 + lVar2;
      tVar5 = tVar5 - lVar2;
    }
    tVar5 = tVar5 + -2;
    puVar6 = puVar6 + 2;
    occ = occ - c;
  } while( true );
}

Assistant:

static int PackBitsDecode(TIFF *tif, uint8_t *op, tmsize_t occ, uint16_t s)
{
    static const char module[] = "PackBitsDecode";
    int8_t *bp;
    tmsize_t cc;
    long n;
    int b;

    (void)s;
    bp = (int8_t *)tif->tif_rawcp;
    cc = tif->tif_rawcc;
    while (cc > 0 && occ > 0)
    {
        n = (long)*bp++;
        cc--;
        if (n < 0)
        {                  /* replicate next byte -n+1 times */
            if (n == -128) /* nop */
                continue;
            n = -n + 1;
            if (occ < (tmsize_t)n)
            {
                TIFFWarningExtR(tif, module,
                                "Discarding %" TIFF_SSIZE_FORMAT
                                " bytes to avoid buffer overrun",
                                (tmsize_t)n - occ);
                n = (long)occ;
            }
            if (cc == 0)
            {
                TIFFWarningExtR(
                    tif, module,
                    "Terminating PackBitsDecode due to lack of data.");
                break;
            }
            occ -= n;
            b = *bp++;
            cc--;
            while (n-- > 0)
                *op++ = (uint8_t)b;
        }
        else
        { /* copy next n+1 bytes literally */
            if (occ < (tmsize_t)(n + 1))
            {
                TIFFWarningExtR(tif, module,
                                "Discarding %" TIFF_SSIZE_FORMAT
                                " bytes to avoid buffer overrun",
                                (tmsize_t)n - occ + 1);
                n = (long)occ - 1;
            }
            if (cc < (tmsize_t)(n + 1))
            {
                TIFFWarningExtR(
                    tif, module,
                    "Terminating PackBitsDecode due to lack of data.");
                break;
            }
            _TIFFmemcpy(op, bp, ++n);
            op += n;
            occ -= n;
            bp += n;
            cc -= n;
        }
    }
    tif->tif_rawcp = (uint8_t *)bp;
    tif->tif_rawcc = cc;
    if (occ > 0)
    {
        TIFFErrorExtR(tif, module, "Not enough data for scanline %" PRIu32,
                      tif->tif_row);
        return (0);
    }
    return (1);
}